

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_AStateProvider_A_GunFlash
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  player_t *this;
  PClass *pPVar2;
  undefined8 in_RAX;
  PClass *pPVar3;
  PClassActor *pPVar4;
  FState *newstate;
  DPSprite *this_00;
  char *pcVar5;
  AWeapon *this_01;
  undefined8 *puVar6;
  undefined8 *puVar7;
  bool bVar8;
  undefined8 local_38;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_0043cc56:
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar7 = (undefined8 *)(param->field_0).field_1.a;
      local_38 = in_RAX;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar7 == (undefined8 *)0x0) goto LAB_0043ca74;
        pPVar3 = (PClass *)puVar7[1];
        if (pPVar3 == (PClass *)0x0) {
          pPVar3 = (PClass *)(**(code **)*puVar7)(puVar7);
          puVar7[1] = pPVar3;
        }
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar2 && bVar8) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar2) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043cc66;
        }
      }
      else {
        if (puVar7 != (undefined8 *)0x0) goto LAB_0043cc4d;
LAB_0043ca74:
        puVar7 = (undefined8 *)0x0;
      }
      pPVar2 = AStateProvider::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_0043cc56;
      if (param[1].field_0.field_3.Type == '\x03') {
        puVar6 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar6 == (undefined8 *)0x0) {
LAB_0043cb02:
            puVar6 = (undefined8 *)0x0;
          }
          else {
            pPVar3 = (PClass *)puVar6[1];
            if (pPVar3 == (PClass *)0x0) {
              pPVar3 = (PClass *)(**(code **)*puVar6)(puVar6);
              puVar6[1] = pPVar3;
            }
            bVar8 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar2 && bVar8) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar8 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar2) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar8) {
              pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_0043cc66;
            }
          }
          if (numparam < 3) goto LAB_0043cc56;
          if (param[2].field_0.field_3.Type != '\x03') {
            pcVar5 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_0043cc66;
          }
          if (numparam == 3) {
            if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
              pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043ccad:
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x561,
                            "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar1 = defaultparam->Array[3].field_0.i;
            pPVar4 = (PClassActor *)puVar6[1];
            if (pPVar4 == (PClassActor *)0x0) {
              pPVar4 = (PClassActor *)(**(code **)*puVar6)(puVar6);
              puVar6[1] = pPVar4;
            }
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar4,false);
LAB_0043cbb4:
            param = defaultparam->Array;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043cc85:
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x562,
                            "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar5 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_0043ccad;
            }
            iVar1 = param[3].field_0.i;
            pPVar4 = (PClassActor *)puVar6[1];
            if (pPVar4 == (PClassActor *)0x0) {
              pPVar4 = (PClassActor *)(**(code **)*puVar6)(puVar6);
              puVar6[1] = pPVar4;
            }
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar4,false);
            if ((uint)numparam < 5) goto LAB_0043cbb4;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar5 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_0043cc85;
            }
          }
          this = (player_t *)puVar7[0x46];
          if (this == (player_t *)0x0) {
            return 0;
          }
          if ((undefined1  [16])((undefined1  [16])param[4].field_0 & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            APlayerPawn::PlayAttacking2(this->mo);
          }
          if (newstate == (FState *)0x0) {
            this_01 = this->ReadyWeapon;
            if (this_01->bAltFire == true) {
              local_38 = CONCAT44(0xa9,local_38._0_4_);
              newstate = AActor::FindState((AActor *)this_01,(FName *)((long)&local_38 + 4));
              if (newstate != (FState *)0x0) goto LAB_0043cc22;
              this_01 = this->ReadyWeapon;
            }
            local_38 = CONCAT44(local_38._4_4_,0xa8);
            newstate = AActor::FindState((AActor *)this_01,(FName *)&local_38);
          }
LAB_0043cc22:
          this_00 = player_t::GetPSprite(this,PSP_FLASH);
          DPSprite::SetState(this_00,newstate,false);
          return 0;
        }
        if (puVar6 == (undefined8 *)0x0) goto LAB_0043cb02;
      }
    }
LAB_0043cc4d:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0043cc66:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x560,
                "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_STATE_ACTION_DEF(flash);
	PARAM_INT_DEF(flags);

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}